

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitIf(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
        *this,IfExpr e)

{
  bool bVar1;
  LogicalExpr e_00;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> expr;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> e_01;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  IfExpr e_local;
  
  value.size_ = 3;
  value.data_ = "if ";
  e_local = e;
  fmt::BasicWriter<char>::operator<<(this->writer_,value);
  e_00 = BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>::
         condition(&e_local);
  Visit(this,(LogicalExpr)e_00.super_ExprBase.impl_,0);
  value_00.size_ = 6;
  value_00.data_ = " then ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
  expr = BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>::
         else_expr(&e_local);
  bVar1 = IsZero<mp::internal::ExprTypes,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>(expr);
  e_01 = BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>::
         then_expr(&e_local);
  Visit(this,(NumericExpr)e_01.super_ExprBase.impl_,2 - (uint)bVar1);
  if (!bVar1) {
    value_01.size_ = 6;
    value_01.data_ = " else ";
    fmt::BasicWriter<char>::operator<<(this->writer_,value_01);
    Visit(this,(NumericExpr)expr.super_ExprBase.impl_,-1);
  }
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIf(IfExpr e) {
  writer_ << "if ";
  Visit(e.condition(), prec::UNKNOWN);
  writer_ << " then ";
  NumericExpr else_expr = e.else_expr();
  bool has_else = !IsZero<ExprTypes>(else_expr);
  Visit(e.then_expr(), prec::CONDITIONAL + (has_else ? 1 : 0));
  if (has_else) {
    writer_ << " else ";
    Visit(else_expr);
  }
}